

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

mg_connection * mg_do_connect(mg_connection *nc,int proto,socket_address *sa)

{
  if (LL_DEBUG < s_cs_log_level) {
    mg_do_connect_cold_1();
  }
  *(byte *)&nc->flags = (byte)nc->flags | 8;
  if (proto == 2) {
    mg_if_connect_udp(nc);
  }
  else {
    mg_if_connect_tcp(nc,sa);
  }
  mg_add_conn(nc->mgr,nc);
  return nc;
}

Assistant:

mg_connection *mg_do_connect(struct mg_connection *nc,
                                                int proto,
                                                union socket_address *sa) {
    DBG(("%p %s://%s:%hu", nc, proto == SOCK_DGRAM ? "udp" : "tcp",
            inet_ntoa(sa->sin.sin_addr), ntohs(sa->sin.sin_port)));

    nc->flags |= MG_F_CONNECTING;
    if (proto == SOCK_DGRAM) {
        mg_if_connect_udp(nc);
    } else {
        mg_if_connect_tcp(nc, sa);
    }
    mg_add_conn(nc->mgr, nc);
    return nc;
}